

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O0

void __thiscall kratos::GeneratorConst::~GeneratorConst(GeneratorConst *this)

{
  GeneratorConst *this_local;
  
  ~GeneratorConst(this);
  operator_delete(this,0x2a8);
  return;
}

Assistant:

explicit GeneratorConst(const Generator &gen) : Const(0, 1, false), gen_(gen) {}